

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialPropsCmd.cpp
# Opt level: O1

void cmdline_parser_print_help(void)

{
  char cVar1;
  char cVar2;
  char **ppcVar3;
  char *__s;
  
  cVar1 = *gengetopt_args_info_purpose;
  cVar2 = *gengetopt_args_info_usage;
  if (cVar2 != '\0') {
    puts(gengetopt_args_info_usage);
  }
  if (cVar1 != '\0') {
    puts(gengetopt_args_info_purpose);
  }
  if (cVar2 != '\0' || cVar1 != '\0') {
    putchar(10);
  }
  if (*gengetopt_args_info_description != '\0') {
    printf("%s\n\n");
  }
  if (gengetopt_args_info_help[0] != (char *)0x0) {
    ppcVar3 = gengetopt_args_info_help;
    __s = gengetopt_args_info_help[0];
    do {
      ppcVar3 = ppcVar3 + 1;
      puts(__s);
      __s = *ppcVar3;
    } while (__s != (char *)0x0);
  }
  return;
}

Assistant:

static void print_help_common(void)
{
	size_t len_purpose = strlen(gengetopt_args_info_purpose);
	size_t len_usage = strlen(gengetopt_args_info_usage);

	if (len_usage > 0) {
		printf("%s\n", gengetopt_args_info_usage);
	}
	if (len_purpose > 0) {
		printf("%s\n", gengetopt_args_info_purpose);
	}

	if (len_usage || len_purpose) {
		printf("\n");
	}

	if (strlen(gengetopt_args_info_description) > 0) {
		printf("%s\n\n", gengetopt_args_info_description);
	}
}